

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O1

int __thiscall
icu_63::TimeZoneNamesDelegate::clone
          (TimeZoneNamesDelegate *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int32_t *piVar1;
  TimeZoneNamesCacheEntry *pTVar2;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)UMemory::operator_new((UMemory *)0x10,(size_t)__fn);
  if (puVar3 == (undefined8 *)0x0) {
    puVar3 = (undefined8 *)0x0;
  }
  else {
    *puVar3 = &PTR__TimeZoneNamesDelegate_003a6f90;
    puVar3[1] = 0;
  }
  if (puVar3 != (undefined8 *)0x0) {
    umtx_lock_63((UMutex *)gTimeZoneNamesLock);
    pTVar2 = this->fTZnamesCacheEntry;
    piVar1 = &pTVar2->refCount;
    *piVar1 = *piVar1 + 1;
    puVar3[1] = pTVar2;
    umtx_unlock_63((UMutex *)gTimeZoneNamesLock);
  }
  return (int)puVar3;
}

Assistant:

TimeZoneNames*
TimeZoneNamesDelegate::clone() const {
    TimeZoneNamesDelegate* other = new TimeZoneNamesDelegate();
    if (other != NULL) {
        umtx_lock(&gTimeZoneNamesLock);
        {
            // Just increment the reference count
            fTZnamesCacheEntry->refCount++;
            other->fTZnamesCacheEntry = fTZnamesCacheEntry;
        }
        umtx_unlock(&gTimeZoneNamesLock);
    }
    return other;
}